

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffInfo.cpp
# Opt level: O0

string * ApprovalTests::DiffInfo::getDefaultArguments_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_78 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_48 [32];
  string local_28 [40];
  
  __lhs = in_RDI;
  receivedFileTemplate_abi_cxx11_();
  ::std::operator+(__lhs,(char)((ulong)in_RDI >> 0x38));
  approvedFileTemplate_abi_cxx11_();
  ::std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  ::std::__cxx11::string::~string(local_78);
  ::std::__cxx11::string::~string(local_28);
  ::std::__cxx11::string::~string(local_48);
  return __lhs;
}

Assistant:

std::string DiffInfo::getDefaultArguments()
    {
        return receivedFileTemplate() + ' ' + approvedFileTemplate();
    }